

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageSorters.h
# Opt level: O2

bool __thiscall FIX::message_order::operator()(message_order *this,int x,int y)

{
  int iVar1;
  bool bVar2;
  
  iVar1 = *(int *)this;
  if (iVar1 == 3) {
    bVar2 = group_order::compare(x,y,(int *)(*(long *)(this + 0x10) + 0xc),*(int *)(this + 0x18));
    return bVar2;
  }
  if (iVar1 != 1) {
    if (iVar1 == 0) {
      bVar2 = header_order::compare(x,y);
      return bVar2;
    }
    return x < y;
  }
  bVar2 = trailer_order::compare(x,y);
  return bVar2;
}

Assistant:

bool operator()(const int x, const int y) const {
    switch (m_mode) {
    case header:
      return header_order::compare(x, y);
    case trailer:
      return trailer_order::compare(x, y);
    case group:
      return group_order::compare(x, y, m_groupOrder, m_largest);
    case normal:
    default:
      return x < y;
    }
  }